

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O0

int __thiscall vm_val_t::is_listlike(vm_val_t *this)

{
  int iVar1;
  char *pcVar2;
  CVmObject *pCVar3;
  undefined4 extraout_var;
  int *in_RDI;
  vm_val_t *in_stack_ffffffffffffffd8;
  bool local_1a;
  bool local_19;
  bool local_9;
  
  pcVar2 = get_as_list(in_stack_ffffffffffffffd8);
  local_9 = true;
  if (pcVar2 == (char *)0x0) {
    local_19 = false;
    if (*in_RDI == 5) {
      pCVar3 = vm_objp(0);
      iVar1 = (*pCVar3->_vptr_CVmObject[0x32])();
      local_1a = true;
      if (CONCAT44(extraout_var,iVar1) == 0) {
        pCVar3 = vm_objp(0);
        iVar1 = (*pCVar3->_vptr_CVmObject[0x33])(pCVar3,(ulong)(uint)in_RDI[2]);
        local_1a = iVar1 != 0;
      }
      local_19 = local_1a;
    }
    local_9 = local_19;
  }
  return (int)local_9;
}

Assistant:

int vm_val_t::is_listlike(VMG0_) const
{
    return (get_as_list(vmg0_) != 0
            || (typ == VM_OBJ
                && (vm_objp(vmg_ val.obj)->get_as_list()
                    || vm_objp(vmg_ val.obj)->is_listlike(vmg_ val.obj))));
}